

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMModule.c
# Opt level: O2

cs_err option(cs_struct *handle,cs_opt_type type,size_t value)

{
  code *pcVar1;
  long lVar2;
  
  if (type == CS_OPT_SYNTAX) {
    ARM_getRegName(handle,(int)value);
    lVar2 = 0xe4;
  }
  else {
    if (type != CS_OPT_MODE) {
      return CS_ERR_OK;
    }
    if ((value & 0x10) == 0) {
      pcVar1 = ARM_getInstruction;
    }
    else {
      pcVar1 = Thumb_getInstruction;
    }
    handle->disasm = pcVar1;
    lVar2 = 4;
  }
  *(int *)((handle->ITBlock).ITStates + lVar2 + -0x5c) = (int)value;
  return CS_ERR_OK;
}

Assistant:

static cs_err option(cs_struct *handle, cs_opt_type type, size_t value)
{
	switch(type) {
		case CS_OPT_MODE:
			if (value & CS_MODE_THUMB)
				handle->disasm = Thumb_getInstruction;
			else
				handle->disasm = ARM_getInstruction;

			handle->mode = value;
			break;
		case CS_OPT_SYNTAX:
			ARM_getRegName(handle, (int)value);
			handle->syntax = (int)value;
			break;
		default:
			break;
	}

	return CS_ERR_OK;
}